

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall
NetOptimize::replace_convolution_with_innerproduct_after_global_pooling(NetOptimize *this)

{
  undefined4 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  bool bVar5;
  reference ppLVar6;
  reference pvVar7;
  size_type sVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  long in_RDI;
  vector<int,_std::allocator<int>_> *in_stack_00000008;
  vector<int,_std::allocator<int>_> *in_stack_00000010;
  ParamDict pd;
  InnerProduct *innerproduct;
  Convolution *convolution;
  size_t j;
  int top_blob_index;
  Pooling *pooling;
  size_t i;
  size_t layer_count;
  Layer *in_stack_ffffffffffffff68;
  value_type in_stack_ffffffffffffff70;
  FILE *__stream;
  ParamDict *this_00;
  ParamDict local_50;
  Layer *local_40;
  value_type local_38;
  size_type local_30;
  value_type local_24;
  value_type local_20;
  size_type local_18;
  ulong local_10;
  
  local_10 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                       (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58));
  local_18 = 0;
  do {
    if (local_10 <= local_18) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),local_18);
    bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
    if (!bVar5) {
      ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                            (in_RDI + 0x58),local_18);
      local_20 = *ppLVar6;
      if (*(int *)((long)&local_20[1].userdata + 4) != 0) {
        ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),local_18);
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar6)->tops,0);
        local_24 = *pvVar7;
        local_30 = local_18;
        do {
          do {
            do {
              local_30 = local_30 + 1;
              if (local_10 <= local_30) goto LAB_0015d69e;
              std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                         local_30);
              bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68
                                     );
            } while (bVar5);
            ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                  (in_RDI + 0x58),local_30);
            sVar8 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar6)->bottoms);
          } while (sVar8 != 1);
          ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                (in_RDI + 0x58),local_30);
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar6)->bottoms,0);
        } while (*pvVar7 != local_24);
LAB_0015d69e:
        if (local_30 != local_10) {
          ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                (in_RDI + 0x58),local_30);
          local_38 = *ppLVar6;
          __stream = _stderr;
          uVar9 = std::__cxx11::string::c_str();
          uVar10 = std::__cxx11::string::c_str();
          fprintf(__stream,"replace_convolution_with_innerproduct_after_global_pooling %s %s\n",
                  uVar9,uVar10);
          local_40 = ncnn::create_layer((char *)in_stack_ffffffffffffff68);
          std::__cxx11::string::operator=((string *)&local_40->type,"InnerProduct");
          std::__cxx11::string::operator=((string *)&local_40->name,(string *)&local_38->name);
          std::vector<int,_std::allocator<int>_>::operator=(in_stack_00000010,in_stack_00000008);
          std::vector<int,_std::allocator<int>_>::operator=(in_stack_00000010,in_stack_00000008);
          this_00 = &local_50;
          ncnn::ParamDict::ParamDict(this_00);
          (*local_40->_vptr_Layer[2])(local_40,this_00);
          *(undefined4 *)&local_40[1]._vptr_Layer = *(undefined4 *)&local_38[1]._vptr_Layer;
          *(undefined4 *)((long)&local_40[1]._vptr_Layer + 4) = *(undefined4 *)&local_38[1].type;
          uVar2 = local_38[1].type.field_0x5;
          uVar3 = local_38[1].type.field_0x6;
          uVar4 = local_38[1].type.field_0x7;
          local_40[1].one_blob_only = (bool)local_38[1].type.field_0x4;
          local_40[1].support_inplace = (bool)uVar2;
          local_40[1].support_vulkan = (bool)uVar3;
          local_40[1].support_packing = (bool)uVar4;
          uVar1 = (undefined4)local_38[1].type._M_string_length;
          local_40[1].support_bf16_storage = (bool)(char)uVar1;
          local_40[1].support_fp16_storage = (bool)(char)((uint)uVar1 >> 8);
          local_40[1].support_int8_storage = (bool)(char)((uint)uVar1 >> 0x10);
          local_40[1].support_image_storage = (bool)(char)((uint)uVar1 >> 0x18);
          ncnn::Mat::operator=((Mat *)__stream,(Mat *)in_stack_ffffffffffffff70);
          ncnn::Mat::operator=((Mat *)__stream,(Mat *)in_stack_ffffffffffffff70);
          ncnn::Mat::operator=((Mat *)__stream,(Mat *)in_stack_ffffffffffffff70);
          ncnn::Mat::operator=((Mat *)__stream,(Mat *)in_stack_ffffffffffffff70);
          uVar1 = *(undefined4 *)((long)&local_38[1].type._M_string_length + 4);
          local_40[1].support_tensor_storage = (bool)(char)uVar1;
          local_40[1].support_weight_fp16_storage = (bool)(char)((uint)uVar1 >> 8);
          local_40[1].support_reserved_0 = (bool)(char)((uint)uVar1 >> 0x10);
          local_40[1].support_reserved_1 = (bool)(char)((uint)uVar1 >> 0x18);
          ncnn::Mat::operator=((Mat *)__stream,(Mat *)in_stack_ffffffffffffff70);
          in_stack_ffffffffffffff68 = local_40;
          ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                (in_RDI + 0x58),local_30);
          *ppLVar6 = in_stack_ffffffffffffff68;
          in_stack_ffffffffffffff70 = local_38;
          if (local_38 != (value_type)0x0) {
            (*local_38->_vptr_Layer[1])();
          }
          ncnn::ParamDict::~ParamDict((ParamDict *)in_stack_ffffffffffffff70);
        }
      }
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

int NetOptimize::replace_convolution_with_innerproduct_after_global_pooling()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Pooling")
            continue;

        ncnn::Pooling* pooling = (ncnn::Pooling*)layers[i];
        if (pooling->global_pooling == 0)
            continue;

        // Pooling - Convolution
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "Convolution")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        ncnn::Convolution* convolution = (ncnn::Convolution*)layers[j];

        fprintf(stderr, "replace_convolution_with_innerproduct_after_global_pooling %s %s\n", pooling->name.c_str(), convolution->name.c_str());

        ncnn::InnerProduct* innerproduct = (ncnn::InnerProduct*)ncnn::create_layer("InnerProduct");

        innerproduct->type = "InnerProduct";
        innerproduct->name = convolution->name;
        innerproduct->bottoms = convolution->bottoms;
        innerproduct->tops = convolution->tops;

        ncnn::ParamDict pd;
        innerproduct->load_param(pd);

        innerproduct->num_output = convolution->num_output;
        innerproduct->bias_term = convolution->bias_term;
        innerproduct->weight_data_size = convolution->weight_data_size;
        innerproduct->int8_scale_term = convolution->int8_scale_term;

        innerproduct->weight_data = convolution->weight_data;
        innerproduct->bias_data = convolution->bias_data;
#if NCNN_INT8
        innerproduct->weight_data_int8_scales = convolution->weight_data_int8_scales;
        innerproduct->bottom_blob_int8_scales = convolution->bottom_blob_int8_scales;
#endif

        innerproduct->activation_type = convolution->activation_type;
        innerproduct->activation_params = convolution->activation_params;

        layers[j] = innerproduct;
        delete convolution;
    }

    return 0;
}